

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusSimulationDataGenerator.cpp
# Opt level: O2

U8 __thiscall
SMBusSimulationDataGenerator::OutputByte(SMBusSimulationDataGenerator *this,U8 byte,bool is_ack)

{
  int iVar1;
  int mask;
  uint uVar2;
  
  iVar1 = SimulationChannelDescriptor::GetCurrentBitState();
  if (iVar1 == 0) {
    for (uVar2 = 0x80; uVar2 != 0; uVar2 = uVar2 >> 1) {
      OutputBit(this,(uint)((uVar2 & byte) != 0));
    }
    OutputBit(this,(uint)!is_ack);
    AdvanceAllBySec(this,1.4999999999999999e-05);
    return byte;
  }
  __assert_fail("mSMBCLK->GetCurrentBitState() == BIT_LOW",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/saleae[P]smbus-analyzer/src/SMBusSimulationDataGenerator.cpp"
                ,0xa4,"U8 SMBusSimulationDataGenerator::OutputByte(const U8, bool)");
}

Assistant:

U8 SMBusSimulationDataGenerator::OutputByte( const U8 byte, bool is_ack )
{
    // SMBCLK must be low
    assert( mSMBCLK->GetCurrentBitState() == BIT_LOW );

    for( int mask = 0x80; mask; mask >>= 1 )
        OutputBit( ( byte & mask ) ? BIT_HIGH : BIT_LOW );

    OutputBit( is_ack ? BIT_LOW : BIT_HIGH );

    // add a small pause
    AdvanceAllBySec( ONE_US * 15 );

    return byte;
}